

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

int main(void)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Calculator calc;
  double local_b8;
  String local_a8;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  Array<asl::Map<asl::String,_double>::KeyVal> local_68;
  Calculator local_60;
  
  local_b8 = 0.0;
  dVar3 = asl::now();
  for (iVar2 = 0; iVar2 != 10000; iVar2 = iVar2 + 1) {
    asl::String::String((String *)&local_60,"-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3");
    asl::String::String(&local_a8,"i");
    local_70 = (double)iVar2;
    asl::Dic<double>::Dic((Dic<double> *)&local_68,&local_a8,&local_70);
    dVar4 = Calculator::eval((String *)&local_60,(Dic<double> *)&local_68);
    local_b8 = local_b8 + dVar4;
    asl::Array<asl::Map<asl::String,_double>::KeyVal>::~Array(&local_68);
    asl::String::~String(&local_a8);
    asl::String::~String((String *)&local_60);
  }
  dVar4 = asl::now();
  local_80 = (dVar4 - dVar3) / 10000.0;
  printf("Eval:    %f (%.3f us)\n",local_b8,local_80 * 1000000.0);
  asl::String::String(&local_a8,"-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3");
  Calculator::Calculator(&local_60,&local_a8);
  asl::String::~String(&local_a8);
  dVar3 = asl::now();
  local_b8 = 0.0;
  for (iVar2 = 0; iVar2 != 10000; iVar2 = iVar2 + 1) {
    asl::String::String(&local_a8,"i");
    pdVar1 = asl::Map<asl::String,_double>::operator[]
                       (&local_60._variables.super_Map<asl::String,_double>,&local_a8);
    *pdVar1 = (double)iVar2;
    dVar4 = Calculator::compute(&local_60);
    local_b8 = local_b8 + dVar4;
    asl::String::~String(&local_a8);
  }
  dVar4 = asl::now();
  local_88 = (dVar4 - dVar3) / 10000.0;
  printf("Compute: %f (%.3f us)\n",local_b8);
  Calculator::~Calculator(&local_60);
  local_90 = asl::now();
  dVar3 = 0.0;
  dVar4 = 0.0;
  for (iVar2 = 0; iVar2 != 50000; iVar2 = iVar2 + 5) {
    dVar5 = cos((double)iVar2);
    dVar6 = dVar4 * 9.869604401089358;
    if (dVar6 < 0.0) {
      local_78 = dVar5;
      dVar6 = sqrt(dVar6);
      dVar5 = local_78;
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar3 = dVar3 + dVar5 * -3.5 + ((dVar6 + -2.0) * 3.141592653589793) / 3.0;
    dVar4 = dVar4 + 1.0;
  }
  dVar4 = asl::now();
  dVar4 = (dVar4 - local_90) / 10000.0;
  printf("Native:  %f (%.3f us)\n",dVar3,dVar4 * 1000000.0);
  printf("\nRelative times:\nnative: 1\ncompute: %.1f\neval: %.1f\n",local_88 / dVar4,
         local_80 / dVar4);
  return 0;
}

Assistant:

int main()
{
	const int n = 10000; // do computation n times

	double t_eval, t_compute, t_native;

	// using eval():
	{
		double y = 0;
		double t1 = now();
		for (int i = 0; i < n; i++) {
			y += Calculator::eval("-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3", Dic<double>("i", i));
		}
		double t2 = now();
		t_eval = (t2 - t1) / n;
		printf("Eval:    %f (%.3f us)\n", y, t_eval * 1e6);
	}

	// parsing once and then using compute():
	{
		Calculator calc("-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3");
		double y = 0;
		double t1 = now();
		for (int i = 0; i < n; i++) {
			y += calc.set("i", i).compute();
		}
		double t2 = now();
		t_compute = (t2 - t1) / n;
		printf("Compute: %f (%.3f us)\n", y, t_compute * 1e6);
	}

	// now the same in native code:
	{
		double y = 0;
		double t1 = now();
		for (int i = 0; i < n; i++)
			y += -3.5*cos(i*5.0) + PI*(-2 + sqrt(i*pow(PI, 2))) / 3;
		double t2 = now();
		t_native = (t2 - t1) / n;
		printf("Native:  %f (%.3f us)\n", y, t_native * 1e6);
	}

	printf("\nRelative times:\nnative: 1\ncompute: %.1f\neval: %.1f\n", t_compute/t_native, t_eval/t_native);
}